

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConditionBinsSelectExpr>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          ConditionBinsSelectExpr *t)

{
  bool bVar1;
  BinsSelectExpr *in_RSI;
  ConditionBinsSelectExpr *in_RDI;
  
  bVar1 = BinsSelectExpr::bad(in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::ConditionBinsSelectExpr>
              ((ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *)in_RSI,
               in_RDI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }